

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementEffects.cpp
# Opt level: O1

void __thiscall Rml::ElementEffects::InstanceEffects(ElementEffects *this)

{
  PropertyId PVar1;
  pointer psVar2;
  RenderManager *pRVar3;
  long *plVar4;
  code *pcVar5;
  bool bVar6;
  int iVar7;
  ComputedValues *pCVar8;
  undefined4 extraout_var;
  Property *pPVar9;
  ElementDocument *this_00;
  DecoratorPtrList *pDVar10;
  element_type *peVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long lVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  long lVar13;
  pointer psVar14;
  char *pcVar15;
  long lVar16;
  RenderManager *pRVar17;
  DecoratorEntryList *this_02;
  ulong uVar18;
  RenderManager *this_03;
  DecoratorsPtr decorators_ptr;
  FiltersPtr filters_ptr;
  PropertySource document_source;
  PropertyId local_122 [2];
  undefined1 local_120 [16];
  ElementEffects *local_110;
  RenderManager *local_108;
  FilterEntryList *local_100;
  undefined1 local_f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  DecoratorDataHandle local_e8;
  BoxArea local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  PropertySource local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  ComputedValues *local_48;
  DecoratorEntryList *local_40;
  StyleSheet *local_38;
  
  if (this->effects_dirty == true) {
    this->effects_dirty = false;
    this->effects_data_dirty = true;
    ReleaseEffects(this);
    local_108 = Element::GetRenderManager(this->element);
    if (local_108 == (RenderManager *)0x0) {
      bVar6 = Assert("Decorators are being instanced before a render manager is available. Is this element attached to the document?"
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementEffects.cpp"
                     ,0x3e);
      if (!bVar6) {
LAB_00229d95:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
    }
    else {
      pCVar8 = Element::GetComputedValues(this->element);
      local_110 = this;
      if ((((pCVar8->common).field_0x1 & 0x80) != 0) || (((pCVar8->rare).field_0x3 & 2) != 0)) {
        iVar7 = (*(this->element->super_ScriptInterface).super_Releasable._vptr_Releasable[4])();
        local_38 = (StyleSheet *)CONCAT44(extraout_var,iVar7);
        if (local_38 == (StyleSheet *)0x0) {
          return;
        }
        local_122[0] = Decorator;
        local_122[1] = MaskImage;
        lVar13 = 0;
        local_40 = &this->mask_images;
        local_48 = pCVar8;
        do {
          PVar1 = local_122[lVar13];
          pPVar9 = Element::GetLocalProperty(this->element,PVar1);
          if ((pPVar9 != (Property *)0x0) && (pPVar9->unit == DECORATOR)) {
            Property::Get<std::shared_ptr<Rml::DecoratorDeclarationList_const>>
                      ((Property *)local_120);
            if (CONCAT62(local_120._2_6_,local_120._0_2_) != 0) {
              local_d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_c8;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"","");
              local_68 = &local_58;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"","");
              local_b8.rule_name._M_string_length = local_60;
              local_b8.path._M_dataplus._M_p = (pointer)&local_b8.path.field_2;
              local_b8.rule_name._M_dataplus._M_p = (pointer)&local_b8.rule_name.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_pi == &local_c8) {
                local_b8.path.field_2._8_8_ = local_c8._8_8_;
              }
              else {
                local_b8.path._M_dataplus._M_p = (pointer)local_d8._M_pi;
              }
              local_b8.path.field_2._M_allocated_capacity._1_7_ =
                   local_c8._M_allocated_capacity._1_7_;
              local_b8.path.field_2._M_local_buf[0] = local_c8._M_local_buf[0];
              if (local_68 == &local_58) {
                local_b8.rule_name.field_2._8_8_ = local_58._8_8_;
              }
              else {
                local_b8.rule_name._M_dataplus._M_p = (pointer)local_68;
              }
              local_b8.rule_name.field_2._M_allocated_capacity._1_7_ =
                   local_58._M_allocated_capacity._1_7_;
              local_b8.rule_name.field_2._M_local_buf[0] = local_58._M_local_buf[0];
              local_58._M_local_buf[0] = '\0';
              local_60 = 0;
              local_b8.line_number = 0;
              local_b8.path._M_string_length = (size_type)local_d0;
              local_c8._M_local_buf[0] = '\0';
              local_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              peVar11 = (pPVar9->source).
                        super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr;
              local_d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_c8;
              local_68 = &local_58;
              if (peVar11 == (element_type *)0x0) {
                this_00 = Element::GetOwnerDocument(local_110->element);
                if (this_00 == (ElementDocument *)0x0) {
                  peVar11 = (PropertySource *)0x0;
                }
                else {
                  ElementDocument::GetSourceURL_abi_cxx11_(this_00);
                  peVar11 = &local_b8;
                  ::std::__cxx11::string::_M_assign((string *)peVar11);
                }
              }
              pDVar10 = StyleSheet::InstanceDecorators
                                  (local_38,local_108,
                                   (DecoratorDeclarationList *)
                                   CONCAT62(local_120._2_6_,local_120._0_2_),peVar11);
              psVar14 = (pDVar10->
                        super__Vector_base<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              psVar2 = (pDVar10->
                       super__Vector_base<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              if (((psVar14 != psVar2) &&
                  ((long)psVar2 - (long)psVar14 >> 4 !=
                   (((long *)CONCAT62(local_120._2_6_,local_120._0_2_))[1] -
                    *(long *)CONCAT62(local_120._2_6_,local_120._0_2_) >> 5) * -0x5555555555555555))
                 && (bVar6 = Assert("RMLUI_ASSERT(decorator_list.empty() || decorator_list.size() == decorators_ptr->list.size())"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementEffects.cpp"
                                    ,0x61), !bVar6)) goto LAB_00229d95;
              this_02 = &local_110->decorators;
              if (PVar1 != Decorator) {
                this_02 = local_40;
              }
              ::std::
              vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
              ::reserve(this_02,(((long *)CONCAT62(local_120._2_6_,local_120._0_2_))[1] -
                                 *(long *)CONCAT62(local_120._2_6_,local_120._0_2_) >> 5) *
                                -0x5555555555555555);
              psVar14 = (pDVar10->
                        super__Vector_base<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              if ((pDVar10->
                  super__Vector_base<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish != psVar14) {
                local_100 = (FilterEntryList *)CONCAT44(local_100._4_4_,(PVar1 == Decorator) + 1);
                lVar16 = 8;
                lVar12 = 0x58;
                uVar18 = 0;
                do {
                  if ((ulong)((((long *)CONCAT62(local_120._2_6_,local_120._0_2_))[1] -
                               *(long *)CONCAT62(local_120._2_6_,local_120._0_2_) >> 5) *
                             -0x5555555555555555) <= uVar18) break;
                  if (*(long *)((long)psVar14 + lVar16 + -8) != 0) {
                    _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    local_e8 = 0;
                    local_f8 = *(undefined1 (*) [8])((long)psVar14 + lVar16 + -8);
                    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                              (&_Stack_f0,
                               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)&(psVar14->
                                       super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr + lVar16));
                    local_e0 = *(BoxArea *)
                                (*(long *)CONCAT62(local_120._2_6_,local_120._0_2_) + lVar12);
                    if (local_e0 == Auto) {
                      local_e0 = (BoxArea)local_100;
                    }
                    if ((2 < local_e0 - Border) &&
                       (bVar6 = Assert("RMLUI_ASSERT(entry.paint_area >= BoxArea::Border && entry.paint_area <= BoxArea::Content)"
                                       ,
                                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementEffects.cpp"
                                       ,0x72), !bVar6)) goto LAB_00229d95;
                    ::std::
                    vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
                    ::emplace_back<Rml::ElementEffects::DecoratorEntry>
                              (this_02,(DecoratorEntry *)local_f8);
                    if ((PropertyDefinition *)_Stack_f0._M_pi != (PropertyDefinition *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (_Stack_f0._M_pi);
                    }
                  }
                  uVar18 = uVar18 + 1;
                  psVar14 = (pDVar10->
                            super__Vector_base<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  lVar16 = lVar16 + 0x10;
                  lVar12 = lVar12 + 0x60;
                } while (uVar18 < (ulong)((long)(pDVar10->
                                                super__Vector_base<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
                                                )._M_impl.super__Vector_impl_data._M_finish -
                                          (long)psVar14 >> 4));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8.rule_name._M_dataplus._M_p != &local_b8.rule_name.field_2) {
                operator_delete(local_b8.rule_name._M_dataplus._M_p,
                                local_b8.rule_name.field_2._M_allocated_capacity + 1);
              }
              this = local_110;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8.path._M_dataplus._M_p != &local_b8.path.field_2) {
                operator_delete(local_b8.path._M_dataplus._M_p,
                                local_b8.path.field_2._M_allocated_capacity + 1);
                this = local_110;
              }
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._8_8_);
            }
          }
          lVar13 = lVar13 + 1;
          pCVar8 = local_48;
        } while (lVar13 != 2);
      }
      if (((pCVar8->rare).field_0x3 & 0xc) != 0) {
        local_120._0_2_ = 0x504f;
        local_100 = &this->backdrop_filters;
        local_108 = (RenderManager *)&this->filters;
        lVar13 = 0;
        do {
          PVar1 = local_120[lVar13];
          pPVar9 = Element::GetLocalProperty(this->element,PVar1);
          if ((pPVar9 != (Property *)0x0) && (pPVar9->unit == FILTER)) {
            Property::Get<std::shared_ptr<Rml::FilterDeclarationList_const>>((Property *)local_f8);
            if (local_f8 != (undefined1  [8])0x0) {
              this_03 = (RenderManager *)local_100;
              if (PVar1 == Filter) {
                this_03 = local_108;
              }
              ::std::
              vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
              ::reserve((vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                         *)this_03,
                        ((long)((Texture *)((long)local_f8 + 8))->render_manager -
                         (long)*(_func_int ***)local_f8 >> 3) * 0x2e8ba2e8ba2e8ba3);
              pRVar3 = ((Texture *)((long)local_f8 + 8))->render_manager;
              for (pRVar17 = (RenderManager *)*(_func_int ***)local_f8; pRVar17 != pRVar3;
                  pRVar17 = (RenderManager *)&pRVar17->state) {
                plVar4 = (long *)(pRVar17->geometry_list).free_slots.
                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                (**(code **)(*plVar4 + 0x10))
                          (&local_b8,plVar4,pRVar17,
                           &(pRVar17->geometry_list).free_slots.
                            super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
                this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          local_b8.path._M_string_length;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8.path._M_dataplus._M_p ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  peVar11 = (pPVar9->source).
                            super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr;
                  pcVar15 = "";
                  if (peVar11 == (element_type *)0x0) {
                    uVar18 = 0xffffffff;
                  }
                  else {
                    pcVar15 = (peVar11->path)._M_dataplus._M_p;
                    uVar18 = (ulong)(uint)peVar11->line_number;
                  }
                  Log::Message(LT_WARNING,
                               "Filter \'%s\' in \'%s\' could not be instanced, declared at %s:%d",
                               pRVar17->render_interface,
                               (((Vector<Texture> *)((long)local_f8 + 0x18))->
                               super__Vector_base<Rml::Texture,_std::allocator<Rml::Texture>_>).
                               _M_impl.super__Vector_impl_data._M_start,pcVar15,uVar18);
                }
                else {
                  local_b8.path.field_2._M_allocated_capacity = 0;
                  local_b8.path.field_2._8_8_ = 0;
                  ::std::
                  vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                  ::emplace_back<Rml::ElementEffects::FilterEntry>
                            ((vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                              *)this_03,(FilterEntry *)&local_b8);
                  CompiledFilter::Release((CompiledFilter *)&local_b8.path.field_2);
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8.path._M_string_length
                      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_b8.path._M_string_length);
                  }
                  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                }
                if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
                }
              }
            }
            this = local_110;
            if ((PropertyDefinition *)_Stack_f0._M_pi != (PropertyDefinition *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_f0._M_pi);
              this = local_110;
            }
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != 2);
      }
    }
  }
  return;
}

Assistant:

void ElementEffects::InstanceEffects()
{
	if (!effects_dirty)
		return;

	effects_dirty = false;
	effects_data_dirty = true;

	RMLUI_ZoneScopedC(0xB22222);
	ReleaseEffects();

	RenderManager* render_manager = element->GetRenderManager();
	if (!render_manager)
	{
		RMLUI_ERRORMSG("Decorators are being instanced before a render manager is available. Is this element attached to the document?");
		return;
	}

	const ComputedValues& computed = element->GetComputedValues();

	if (computed.has_decorator() || computed.has_mask_image())
	{
		const StyleSheet* style_sheet = element->GetStyleSheet();
		if (!style_sheet)
			return;

		for (const auto id : {PropertyId::Decorator, PropertyId::MaskImage})
		{
			const Property* property = element->GetLocalProperty(id);
			if (!property || property->unit != Unit::DECORATOR)
				continue;

			DecoratorsPtr decorators_ptr = property->Get<DecoratorsPtr>();
			if (!decorators_ptr)
				continue;

			PropertySource document_source("", 0, "");
			const PropertySource* source = property->source.get();

			if (!source)
			{
				if (ElementDocument* document = element->GetOwnerDocument())
				{
					document_source.path = document->GetSourceURL();
					source = &document_source;
				}
			}

			const DecoratorPtrList& decorator_list = style_sheet->InstanceDecorators(*render_manager, *decorators_ptr, source);
			RMLUI_ASSERT(decorator_list.empty() || decorator_list.size() == decorators_ptr->list.size());

			DecoratorEntryList& decorators_target = (id == PropertyId::Decorator ? decorators : mask_images);
			decorators_target.reserve(decorators_ptr->list.size());

			for (size_t i = 0; i < decorator_list.size() && i < decorators_ptr->list.size(); i++)
			{
				const SharedPtr<const Decorator>& decorator = decorator_list[i];
				if (decorator)
				{
					DecoratorEntry entry;
					entry.decorator_data = 0;
					entry.decorator = decorator;
					entry.paint_area = decorators_ptr->list[i].paint_area;
					if (entry.paint_area == BoxArea::Auto)
						entry.paint_area = (id == PropertyId::Decorator ? BoxArea::Padding : BoxArea::Border);

					RMLUI_ASSERT(entry.paint_area >= BoxArea::Border && entry.paint_area <= BoxArea::Content);
					decorators_target.push_back(std::move(entry));
				}
			}
		}
	}

	if (computed.has_filter() || computed.has_backdrop_filter())
	{
		for (const auto id : {PropertyId::Filter, PropertyId::BackdropFilter})
		{
			const Property* property = element->GetLocalProperty(id);
			if (!property || property->unit != Unit::FILTER)
				continue;

			FiltersPtr filters_ptr = property->Get<FiltersPtr>();
			if (!filters_ptr)
				continue;

			FilterEntryList& list = (id == PropertyId::Filter ? filters : backdrop_filters);
			list.reserve(filters_ptr->list.size());

			for (const FilterDeclaration& declaration : filters_ptr->list)
			{
				SharedPtr<const Filter> filter = declaration.instancer->InstanceFilter(declaration.type, declaration.properties);
				if (filter)
				{
					list.push_back({std::move(filter), CompiledFilter{}});
				}
				else
				{
					const auto& source = property->source;
					Log::Message(Log::LT_WARNING, "Filter '%s' in '%s' could not be instanced, declared at %s:%d", declaration.type.c_str(),
						filters_ptr->value.c_str(), source ? source->path.c_str() : "", source ? source->line_number : -1);
				}
			}
		}
	}
}